

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_9::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  long __offset;
  Fault f;
  ssize_t n;
  DebugComparison<long_&,_int> _kjCondition;
  Fault local_68;
  ssize_t local_60;
  DebugComparison<long_&,_int> local_58;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
LAB_0020672c:
    do {
      local_60 = pwrite64((this->fd).fd,__buf,__n,__offset);
      if (local_60 < 0) {
        iVar1 = kj::_::Debug::getOsErrorNumber(false);
        if (iVar1 == -1) goto LAB_0020672c;
      }
      else {
        iVar1 = 0;
      }
      if (iVar1 != 0) {
        local_68.exception = (Exception *)0x0;
        local_58.left = (long *)0x0;
        local_58.right = 0;
        local_58._12_4_ = 0;
        kj::_::Debug::Fault::init
                  (&local_68,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_68);
      }
      local_58.left = &local_60;
      local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
      local_58.op.content.ptr = " > ";
      local_58.op.content.size_ = 4;
      local_58.result = 0 < local_60;
      if (local_60 < 1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x187,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",&local_58,
                   (char (*) [24])"pwrite() returned zero?");
        kj::_::Debug::Fault::fatal(&local_68);
      }
      __offset = __offset + local_60;
      __buf = (void *)((long)__buf + local_60);
      __n = __n - local_60;
      in_RAX = local_60;
    } while (__n != 0);
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }